

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.cc
# Opt level: O0

bool absl::Condition::GuaranteedEqual(Condition *a,Condition *b)

{
  bool local_22;
  bool local_21;
  Condition *b_local;
  Condition *a_local;
  
  if (a == (Condition *)0x0) {
    local_21 = true;
    if (b != (Condition *)0x0) {
      local_21 = b->eval_ == (_func_bool_Condition_ptr *)0x0;
    }
    a_local._7_1_ = local_21;
  }
  else if ((b == (Condition *)0x0) || (b->eval_ == (_func_bool_Condition_ptr *)0x0)) {
    a_local._7_1_ = a->eval_ == (_func_bool_Condition_ptr *)0x0;
  }
  else {
    local_22 = false;
    if ((a->eval_ == b->eval_) &&
       ((local_22 = false, a->function_ == b->function_ && (local_22 = false, a->arg_ == b->arg_))))
    {
      local_22 = a->method_ == b->method_ &&
                 (a->method_ == 0 || *(long *)&a->field_0x18 == *(long *)&b->field_0x18);
    }
    a_local._7_1_ = local_22;
  }
  return a_local._7_1_;
}

Assistant:

bool Condition::GuaranteedEqual(const Condition *a, const Condition *b) {
  if (a == nullptr) {
    return b == nullptr || b->eval_ == nullptr;
  }
  if (b == nullptr || b->eval_ == nullptr) {
    return a->eval_ == nullptr;
  }
  return a->eval_ == b->eval_ && a->function_ == b->function_ &&
         a->arg_ == b->arg_ && a->method_ == b->method_;
}